

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O1

istream * amrex::operator>>(istream *is,expect *exp)

{
  int iVar1;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  char c;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar1 = (int)(exp->istr)._M_string_length;
  iVar6 = 0;
  do {
    if (iVar1 <= iVar6) break;
    std::operator>>(is,(char *)&local_68);
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
      lVar5 = (long)iVar6;
      iVar6 = iVar6 + 1;
      bVar2 = true;
      if ((char)local_68 != (exp->istr)._M_dataplus._M_p[lVar5]) {
        std::istream::putback((char)is);
        goto LAB_00457adf;
      }
    }
    else {
LAB_00457adf:
      bVar2 = false;
    }
  } while (bVar2);
  if (iVar6 != iVar1) {
    std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
    std::operator+(&local_48,"expect fails to find \"",&exp->istr);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_58 = *plVar4;
      lStack_50 = plVar3[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar4;
      local_68 = (long *)*plVar3;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    Error_host((char *)local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
  }
  return is;
}

Assistant:

std::istream&
amrex::operator>>(std::istream& is, const expect& exp)
{
    int len = exp.istr.size();
    int n = 0;
    while ( n < len )
    {
        char c;
        is >> c;
        if ( !is ) break;
        if ( c != exp.istr[n++] )
        {
            is.putback(c);
            break;
        }
    }
    if ( n != len )
    {
        is.clear(std::ios::badbit|is.rdstate());
        std::string msg = "expect fails to find \"" + exp.the_string() + "\"";
        amrex::Error(msg.c_str());
    }
    return is;
}